

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

string * randomfloats_abi_cxx11_(string *__return_storage_ptr__,uint64_t howmany)

{
  long lVar1;
  double dVar2;
  ostream *poVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  stringstream out;
  long local_1a8;
  undefined8 local_1a0 [46];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  lVar4 = 0x4a6;
  for (uVar5 = 1; lVar1 = lVar4, uVar5 <= howmany; uVar5 = uVar5 + 1) {
    do {
      lVar4 = lVar1;
      dVar2 = (double)rng(uVar5 + lVar4);
      lVar1 = lVar4 + 1;
    } while (0x7fefffffffffffff < (ulong)ABS(dVar2));
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0xf;
    poVar3 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar3," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string randomfloats(uint64_t howmany) {
  std::stringstream out;
  uint64_t offset = 1190;
  for (size_t i = 1; i <= howmany; i++) {
    uint64_t x = rng(i + offset);
    double d;
    ::memcpy(&d, &x, sizeof(double));
    // paranoid
    while (!std::isfinite(d)) {
      offset++;
      x = rng(i + offset);
      ::memcpy(&d, &x, sizeof(double));
    }
    out << std::setprecision(DBL_DIG) << d << " ";
  }
  return out.str();
}